

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O1

UINT8 device_start_gameboy_sound(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  DEV_DATA DVar3;
  gb_sound_t *gb;
  UINT8 UVar4;
  
  DVar3.chipInf = calloc(1,0x138);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar4 = 0xff;
  }
  else {
    uVar1 = cfg->clock;
    uVar2 = uVar1 >> 6;
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf = uVar2;
    if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (uVar2 < cfg->smplRate)))) {
      *(UINT32 *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf = cfg->smplRate;
    }
    *(byte *)&((DEV_DATA *)((long)DVar3.chipInf + 0x130))->chipInf = cfg->flags & 1;
    uVar2 = *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf;
    UVar4 = '\0';
    ((DEV_DATA *)((long)DVar3.chipInf + 0x120))->chipInf =
         (void *)(CONCAT44(uVar1,uVar2 >> 1) / (ulong)uVar2);
    *(undefined1 *)((long)DVar3.chipInf + 0x3e) = 0;
    *(undefined1 *)((long)DVar3.chipInf + 0x72) = 0;
    *(undefined1 *)((long)DVar3.chipInf + 0xa6) = 0;
    *(undefined1 *)((long)DVar3.chipInf + 0xda) = 0;
    *(undefined2 *)((long)DVar3.chipInf + 0x131) = 0;
    *(undefined1 *)((long)DVar3.chipInf + 0x133) = 0;
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar4;
}

Assistant:

static UINT8 device_start_gameboy_sound(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	gb_sound_t *gb;

	gb = (gb_sound_t *)calloc(1, sizeof(gb_sound_t));
	if (gb == NULL)
		return 0xFF;

	gb->rate = cfg->clock / 64;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, gb->rate, cfg->smplRate);

	gb->gbMode = (cfg->flags & 0x01) ? GBMODE_CGB04 : GBMODE_DMG;
	RC_SET_RATIO(&gb->cycleCntr, cfg->clock, gb->rate);

	gameboy_sound_set_mute_mask(gb, 0x00);
	gb->BoostWaveChn = 0x00;
	gb->NoWaveCorrupt = 0x00;
	gb->LegacyMode = 0x00;

	gb->_devData.chipInf = gb;
	INIT_DEVINF(retDevInf, &gb->_devData, gb->rate, &devDef);

	return 0x00;
}